

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventReportReliablePdu.cpp
# Opt level: O1

void __thiscall DIS::EventReportReliablePdu::~EventReportReliablePdu(EventReportReliablePdu *this)

{
  pointer pFVar1;
  pointer pFVar2;
  pointer pVVar3;
  pointer pVVar4;
  pointer pVVar5;
  pointer pFVar6;
  
  (this->super_SimulationManagementWithReliabilityFamilyPdu).super_Pdu.super_PduSuperclass.
  _vptr_PduSuperclass = (_func_int **)&PTR__EventReportReliablePdu_001b4a10;
  pFVar1 = (this->_fixedDatumRecords).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar2 = (this->_fixedDatumRecords).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pFVar6 = pFVar1;
  if (pFVar2 != pFVar1) {
    do {
      (**pFVar6->_vptr_FixedDatum)(pFVar6);
      pFVar6 = pFVar6 + 1;
    } while (pFVar6 != pFVar2);
    (this->_fixedDatumRecords).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar1;
  }
  pVVar3 = (this->_variableDatumRecords).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4 = (this->_variableDatumRecords).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar5 = pVVar3;
  if (pVVar4 != pVVar3) {
    do {
      (**pVVar5->_vptr_VariableDatum)(pVVar5);
      pVVar5 = pVVar5 + 1;
    } while (pVVar5 != pVVar4);
    (this->_variableDatumRecords).
    super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar3;
  }
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::~vector
            (&this->_variableDatumRecords);
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::~vector(&this->_fixedDatumRecords)
  ;
  SimulationManagementWithReliabilityFamilyPdu::~SimulationManagementWithReliabilityFamilyPdu
            (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  return;
}

Assistant:

EventReportReliablePdu::~EventReportReliablePdu()
{
    _fixedDatumRecords.clear();
    _variableDatumRecords.clear();
}